

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.c
# Opt level: O2

int16_t OpalOperator_Output(OpalOperator *self,uint16_t keyscalenum,uint32_t phase_step,
                           int16_t vibrato,int16_t mod,int16_t fbshift)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  short sVar6;
  ushort uVar7;
  uint uVar8;
  undefined6 in_register_00000032;
  uint uVar9;
  int iVar10;
  ushort uVar11;
  
  if (self->VibratoEnable == 0) {
    phase_step = 0;
  }
  uVar8 = ((uint)self->FreqMultTimes2 *
           (phase_step + (int)CONCAT62(in_register_00000032,keyscalenum)) >> 1) + self->Phase;
  uVar3 = (uint)(ushort)vibrato;
  self->Phase = uVar8;
  if (self->TremoloEnable == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = (uint)self->Master->TremoloLevel;
  }
  if (3 < (uint)self->EnvelopeStage) goto LAB_0013fa01;
  uVar2 = self->EnvelopeLevel;
  switch(self->EnvelopeStage) {
  case 0:
    uVar11 = self->Master->Clock;
    uVar7 = 0;
    sVar6 = (short)((int)(short)~uVar2 *
                    (uint)(self->AttackAdd >>
                          ((byte)self->AttackTab[uVar11 >> ((byte)self->AttackShift & 0x1f) & 7] &
                          0x1f)) >> 3);
    if (self->AttackRate == 0) {
      sVar6 = 0;
    }
    if ((self->AttackMask & uVar11) != 0) {
      sVar6 = 0;
    }
    self->EnvelopeLevel = sVar6 + uVar2;
    if ((short)(sVar6 + uVar2) < 1) {
      iVar10 = 1;
LAB_0013fa5c:
      self->EnvelopeLevel = uVar7;
      self->EnvelopeStage = iVar10;
    }
    break;
  case 1:
    uVar7 = self->Master->Clock;
    uVar11 = self->DecayAdd >>
             ((byte)self->DecayTab[uVar7 >> ((byte)self->DecayShift & 0x1f) & 7] & 0x1f);
    if (self->DecayRate == 0) {
      uVar11 = 0;
    }
    if ((self->DecayMask & uVar7) != 0) {
      uVar11 = 0;
    }
    self->EnvelopeLevel = uVar2 + uVar11;
    uVar7 = self->SustainLevel;
    if ((int)(uint)uVar7 <= (int)(short)(uVar2 + uVar11)) {
      iVar10 = 2;
      goto LAB_0013fa5c;
    }
    break;
  case 2:
    if (self->SustainMode == 0) goto switchD_0013f943_caseD_3;
    break;
  case 3:
switchD_0013f943_caseD_3:
    uVar7 = self->Master->Clock;
    uVar11 = self->ReleaseAdd >>
             ((byte)self->ReleaseTab[uVar7 >> ((byte)self->ReleaseShift & 0x1f) & 7] & 0x1f);
    if (self->ReleaseRate == 0) {
      uVar11 = 0;
    }
    if ((self->ReleaseMask & uVar7) != 0) {
      uVar11 = 0;
    }
    self->EnvelopeLevel = uVar2 + uVar11;
    if (0x1fe < (short)(uVar2 + uVar11)) {
      self->EnvelopeLevel = 0x1ff;
      self->EnvelopeStage = -1;
LAB_0013fa01:
      self->Out[0] = 0;
      self->Out[1] = 0;
      return 0;
    }
  }
  if (mod != 0) {
    uVar3 = uVar3 + ((int)self->Out[1] + (int)self->Out[0] >> ((byte)mod & 0x1f));
  }
  uVar3 = uVar3 + (uVar8 >> 10);
  uVar8 = uVar3 & 0xffff;
  if (6 < self->Waveform) {
    uVar8 = (uVar3 & 0x1ff) << 3;
    uVar4 = uVar8 ^ 0xff8;
    if ((uVar3 & 0x200) == 0) {
      uVar4 = uVar8;
    }
    uVar7 = (ushort)((uVar3 & 0x200) >> 9);
    goto LAB_0013fb8d;
  }
  uVar4 = uVar3 & 0xff;
  bVar1 = (byte)uVar3;
  switch(self->Waveform) {
  case 0:
    if ((uVar8 >> 8 & 1) != 0) {
      bVar1 = ~bVar1;
    }
    uVar4 = (uint)LogSinTable[bVar1];
    uVar7 = (ushort)(uVar8 >> 9) & 1;
    goto LAB_0013fb8d;
  case 1:
    if ((uVar8 >> 8 & 1) != 0) {
      uVar4 = ~uVar4;
    }
    iVar10 = 9;
    uVar4 = uVar4 & 0xff;
    goto LAB_0013fb48;
  case 2:
    if ((uVar8 >> 8 & 1) != 0) {
      bVar1 = ~bVar1;
    }
    uVar5 = (ulong)bVar1;
    break;
  case 3:
    iVar10 = 8;
LAB_0013fb48:
    uVar5 = (ulong)uVar4;
    if ((uVar8 >> iVar10 & 1) != 0) {
      uVar5 = 0;
    }
    break;
  case 4:
    if ((uVar8 >> 9 & 1) == 0) {
      uVar3 = ((uint)(int)(char)uVar8 >> 7 ^ uVar4 * 2) & 0xfe;
      uVar7 = (ushort)(uVar8 >> 8) & 1;
    }
    else {
      uVar3 = 0;
      uVar7 = 0;
    }
    uVar4 = (uint)LogSinTable[uVar3];
    goto LAB_0013fb8d;
  case 5:
    if ((uVar8 >> 9 & 1) == 0) {
      uVar3 = ~(uVar4 * 2);
      if (-1 < (char)uVar8) {
        uVar3 = uVar4 * 2;
      }
      uVar5 = (ulong)uVar3 & 0xff;
    }
    else {
      uVar5 = 0;
    }
    break;
  case 6:
    uVar7 = (ushort)(uVar8 >> 9) & 1;
    uVar4 = 0;
    goto LAB_0013fb8d;
  }
  uVar4 = (uint)LogSinTable[uVar5];
  uVar7 = 0;
LAB_0013fb8d:
  uVar4 = uVar4 + ((ushort)(self->OutputLevel + uVar2 + self->KeyScaleLevel) + uVar9) * 8;
  uVar3 = 0x1fff;
  if ((ushort)uVar4 < 0x1fff) {
    uVar3 = uVar4;
  }
  uVar2 = -(ushort)(uVar7 != 0) ^
          (short)((int)(short)(ExpTable[uVar3 & 0xff] + 0x400) >> ((byte)(uVar3 >> 8) & 0x1f)) * 2;
  self->Out[1] = self->Out[0];
  self->Out[0] = uVar2;
  return uVar2;
}

Assistant:

static int16_t OpalOperator_Output(OpalOperator *self, uint16_t keyscalenum, uint32_t phase_step, int16_t vibrato, int16_t mod, int16_t fbshift)
{
    int16_t v;
    uint16_t mix, phase, offset, logsin, add, level, negate;

    (void)keyscalenum;

    /* Advance wave phase */
    if(self->VibratoEnable)
        phase_step += vibrato;

    self->Phase += (phase_step * self->FreqMultTimes2) / 2;

    level = (self->EnvelopeLevel + self->OutputLevel + self->KeyScaleLevel + (self->TremoloEnable ? self->Master->TremoloLevel : 0)) << 3;

    switch(self->EnvelopeStage)
    {

    /* Attack stage */
    case OpalEnvAtt:
    {
        add = ((self->AttackAdd >> self->AttackTab[self->Master->Clock >> self->AttackShift & 7]) * ~self->EnvelopeLevel) >> 3;

        if(self->AttackRate == 0)
            add = 0;

        if(self->AttackMask && (self->Master->Clock & self->AttackMask))
            add = 0;

        self->EnvelopeLevel += add;

        if(self->EnvelopeLevel <= 0)
        {
            self->EnvelopeLevel = 0;
            self->EnvelopeStage = OpalEnvDec;
        }

        break;
    }

    /* Decay stage */
    case OpalEnvDec:
    {
        add = self->DecayAdd >> self->DecayTab[self->Master->Clock >> self->DecayShift & 7];

        if(self->DecayRate == 0)
            add = 0;

        if(self->DecayMask && (self->Master->Clock & self->DecayMask))
            add = 0;

        self->EnvelopeLevel += add;

        if(self->EnvelopeLevel >= self->SustainLevel)
        {
            self->EnvelopeLevel = self->SustainLevel;
            self->EnvelopeStage = OpalEnvSus;
        }

        break;
    }

    /* Sustain stage */
    case OpalEnvSus:
    {
        if(self->SustainMode)
            break;

        /* Note: fall-through! */

    } /* fallthrough */

    /* Release stage */
    case OpalEnvRel:
    {
        add = self->ReleaseAdd >> self->ReleaseTab[self->Master->Clock >> self->ReleaseShift & 7];

        if(self->ReleaseRate == 0)
            add = 0;

        if(self->ReleaseMask && (self->Master->Clock & self->ReleaseMask))
            add = 0;

        self->EnvelopeLevel += add;

        if(self->EnvelopeLevel >= 0x1FF)
        {
            self->EnvelopeLevel = 0x1FF;
            self->EnvelopeStage = OpalEnvOff;
            self->Out[0] = self->Out[1] = 0;
            return 0;
        }

        break;
    }

    /* Envelope, and therefore the operator, is not running */
    default:
        self->Out[0] = self->Out[1] = 0;
        return 0;
    }

    /* Feedback?  In that case we modulate by a blend of the last two samples */
    if(fbshift)
        mod += (self->Out[0] + self->Out[1]) >> fbshift;

    phase = (self->Phase >> 10) + mod;
    offset = phase & 0xFF;
    negate = OPAL_FALSE;

    switch(self->Waveform)
    {

    /*------------------------------------
     * Standard sine wave
     *------------------------------------*/
    case 0:
        if(phase & 0x100)
            offset ^= 0xFF;

        logsin = LogSinTable[offset];
        negate = (phase & 0x200) != 0;
        break;

    /*------------------------------------
     * Half sine wave
     *------------------------------------*/
    case 1:
        if(phase & 0x200)
            offset = 0;
        else if(phase & 0x100)
            offset ^= 0xFF;

        logsin = LogSinTable[offset];
        break;

    /*------------------------------------
     * Positive sine wave
     *------------------------------------*/
    case 2:
        if(phase & 0x100)
            offset ^= 0xFF;

        logsin =  LogSinTable[offset];
        break;

    /*------------------------------------
     * Quarter positive sine wave
     *------------------------------------*/
    case 3:
        if(phase & 0x100)
            offset = 0;

        logsin = LogSinTable[offset];
        break;

    /*------------------------------------
     * Double-speed sine wave
     *------------------------------------*/
    case 4:
        if(phase & 0x200)
            offset = 0;

        else
        {

            if(phase & 0x80)
                offset ^= 0xFF;

            offset = (offset + offset) & 0xFF;
            negate = (phase & 0x100) != 0;
        }

        logsin = LogSinTable[offset];
        break;

    /*------------------------------------
     * Double-speed positive sine wave
     *------------------------------------*/
    case 5:
        if(phase & 0x200)
            offset = 0;

        else
        {

            offset = (offset + offset) & 0xFF;

            if(phase & 0x80)
                offset ^= 0xFF;
        }

        logsin = LogSinTable[offset];
        break;

    /*------------------------------------
     * Square wave
     *------------------------------------*/
    case 6:
        logsin = 0;
        negate = (phase & 0x200) != 0;
        break;

    /*------------------------------------
     * Exponentiation wave
     *------------------------------------*/
    default:
        logsin = phase & 0x1FF;

        if(phase & 0x200)
        {
            logsin ^= 0x1FF;
            negate = OPAL_TRUE;
        }

        logsin <<= 3;
        break;
    }

    mix = logsin + level;

    if(mix > 0x1FFF)
        mix = 0x1FFF;

    /* From the OPLx decapsulated docs:
     * "When such a table is used for calculation of the exponential, the table is read at the
     * position given by the 8 LSB's of the input. The value + 1024 (the hidden bit) is then the
     * significand of the floating point output and the yet unused MSB's of the input are the
     * exponent of the floating point output." */
    v = ExpTable[mix & 0xFF] + 1024;
    v >>= mix >> 8;
    v += v;

    if(negate)
        v = ~v;

    /* Keep last two results for feedback calculation */
    self->Out[1] = self->Out[0];
    self->Out[0] = v;

    return v;
}